

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

HullError __thiscall
ConvexDecomposition::HullLibrary::ReleaseResult(HullLibrary *this,HullResult *result)

{
  if (result->mOutputVertices != (float *)0x0) {
    free(result->mOutputVertices);
    result->mOutputVertices = (float *)0x0;
  }
  if (result->mIndices != (uint *)0x0) {
    free(result->mIndices);
    result->mIndices = (uint *)0x0;
  }
  return QE_OK;
}

Assistant:

HullError HullLibrary::ReleaseResult(HullResult &result) // release memory allocated for this result, we are done with it.
{
	if ( result.mOutputVertices )
	{
		free(result.mOutputVertices);
		result.mOutputVertices = 0;
	}
	if ( result.mIndices )
	{
		free(result.mIndices);
		result.mIndices = 0;
	}
	return QE_OK;
}